

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O0

string * __thiscall
BasePort::PortTypeString_abi_cxx11_(string *__return_storage_ptr__,BasePort *this,PortType portType)

{
  allocator<char> local_28;
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25 [16];
  allocator<char> local_15;
  int local_14;
  string *psStack_10;
  PortType portType_local;
  
  local_14 = (int)this;
  psStack_10 = __return_storage_ptr__;
  if (local_14 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Firewire",&local_15);
    std::allocator<char>::~allocator(&local_15);
  }
  else if (local_14 == 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Ethernet-Raw",local_25);
    std::allocator<char>::~allocator(local_25);
  }
  else if (local_14 == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Ethernet-UDP",&local_26);
    std::allocator<char>::~allocator(&local_26);
  }
  else if (local_14 == 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Zynq-EMIO",&local_27);
    std::allocator<char>::~allocator(&local_27);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Unknown",&local_28);
    std::allocator<char>::~allocator(&local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BasePort::PortTypeString(PortType portType)
{
    if (portType == PORT_FIREWIRE)
        return std::string("Firewire");
    else if (portType == PORT_ETH_RAW)
        return std::string("Ethernet-Raw");
    else if (portType == PORT_ETH_UDP)
        return std::string("Ethernet-UDP");
    else if (portType == PORT_ZYNQ_EMIO)
        return std::string("Zynq-EMIO");
    else
        return std::string("Unknown");
}